

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O1

void clausifyMode(Problem *problem,bool theory)

{
  List<Kernel::Unit_*> **ppLVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  ImmediateSimplificationEngine *pIVar8;
  Clause *pCVar9;
  Formula *pFVar10;
  Unit *this;
  ostream *poVar11;
  bool bVar12;
  Unit *unit;
  Unit *unit_00;
  Unit *unit_01;
  Inference *pIVar13;
  ulong in_R8;
  ClauseIterator cit;
  ScopedPtr<Kernel::Problem> prb;
  CompositeISE simplifier;
  Options *in_stack_000000a0;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  void *local_b8;
  string *psStack_b0;
  undefined1 local_a8 [22];
  NonspecificInference0 local_92;
  CompositeISE local_90;
  Literal *local_70;
  Literal *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  Entry *pEStack_58;
  SplitSet *local_50;
  void *pvStack_48;
  void *local_40;
  string *in_stack_ffffffffffffffc8;
  
  local_90.super_ImmediateSimplificationEngine.super_InferenceEngine._salg =
       (SaturationAlgorithm *)0x0;
  local_90.super_ImmediateSimplificationEngine.super_InferenceEngine._vptr_InferenceEngine =
       (_func_int **)&PTR__CompositeISE_00b657f8;
  local_90._inners = (ISList *)0x0;
  local_90._innersMany = (ISList *)0x0;
  pIVar8 = (ImmediateSimplificationEngine *)operator_new(0x10);
  (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
  (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_00b65b18;
  Inferences::CompositeISE::addFront(&local_90,pIVar8);
  pIVar8 = (ImmediateSimplificationEngine *)operator_new(0x18);
  (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_00b66888;
  *(undefined1 *)&pIVar8[1].super_InferenceEngine._vptr_InferenceEngine = 1;
  Inferences::CompositeISE::addFront(&local_90,pIVar8);
  pIVar8 = (ImmediateSimplificationEngine *)operator_new(0x10);
  (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
  (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_00b65a58;
  Inferences::CompositeISE::addFront(&local_90,pIVar8);
  if (*(long *)(Lib::env + 0x8d70) != 0) {
    Shell::Options::sampleStrategy(in_stack_000000a0,in_stack_ffffffffffffffc8);
  }
  preprocessProblem(problem);
  local_a8._8_8_ = problem;
  Shell::UIHelper::outputSymbolDeclarations((ostream *)&std::cout);
  Kernel::Problem::clauseIterator((Problem *)local_a8);
  bVar12 = false;
  while( true ) {
    cVar5 = (**(code **)&((*(Unit **)local_a8._0_8_)->_inference).field_0x8)();
    if (cVar5 == '\0') break;
    pCVar9 = (Clause *)(*(code *)((*(Unit **)local_a8._0_8_)->_inference)._splits)();
    pCVar9 = Inferences::CompositeISE::simplify(&local_90,pCVar9);
    if (pCVar9 != (Clause *)0x0) {
      bVar12 = (bool)(bVar12 | ((undefined1  [48])(pCVar9->super_Unit)._inference &
                               (undefined1  [48])0x18) == (undefined1  [48])0x8);
      if (theory) {
        pFVar10 = Kernel::Formula::fromClause(pCVar9);
        pIVar13 = &(pCVar9->super_Unit)._inference;
        if (((uint)*(ulong *)pIVar13 & 0x1c) == 8) {
          *(ulong *)pIVar13 = *(ulong *)pIVar13 | 0xc;
        }
        this = (Unit *)operator_new(0x48,8);
        local_d8._0_8_ = *(undefined8 *)pIVar13;
        local_d8._8_8_ = *(undefined8 *)&(pCVar9->super_Unit)._inference.field_0x8;
        local_c8._M_allocated_capacity = (size_type)(pCVar9->super_Unit)._inference._splits;
        local_c8._8_8_ = (pCVar9->super_Unit)._inference._ptr1;
        local_b8 = (pCVar9->super_Unit)._inference._ptr2;
        psStack_b0 = *(string **)&(pCVar9->super_Unit)._inference.th_ancestors;
        Kernel::Unit::Unit(this,FORMULA,(Inference *)local_d8);
        *(Formula **)(this + 1) = pFVar10;
        *(undefined8 *)&this[1]._inference = 3;
        Kernel::Unit::doUnitTracing(this);
        this->_number = (pCVar9->super_Unit)._number;
        Shell::TPTPPrinter::toString_abi_cxx11_((string *)local_d8,(TPTPPrinter *)this,unit_00);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_d8._0_8_,local_d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      }
      else {
        Shell::TPTPPrinter::toString_abi_cxx11_((string *)local_d8,(TPTPPrinter *)pCVar9,unit);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_d8._0_8_,local_d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._M_allocated_capacity + 1));
      }
    }
  }
  if ((!bVar12) && (*(char *)(Shell::UIHelper::_loadedPieces._16_8_ + -4) == '\x01')) {
    uVar6 = Kernel::Signature::addFreshPredicate(DAT_00b7e1b0,0,"p",(char *)0x0);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = in_R8;
    local_70 = Kernel::Literal::create
                         ((Literal *)(ulong)uVar6,1,false,
                          (initializer_list<Kernel::TermList>)(auVar2 << 0x40));
    auVar3._8_8_ = 0;
    auVar3._0_8_ = in_R8;
    local_68 = Kernel::Literal::create
                         ((Literal *)(ulong)uVar6,0,false,
                          (initializer_list<Kernel::TermList>)(auVar3 << 0x40));
    local_92.inputType = NEGATED_CONJECTURE;
    local_92.rule = INPUT;
    Kernel::Inference::Inference((Inference *)&local_60,&local_92);
    psStack_b0 = in_stack_ffffffffffffffc8;
    local_b8 = local_40;
    local_c8._M_allocated_capacity = (size_type)local_50;
    local_c8._8_8_ = pvStack_48;
    local_d8._0_8_ = local_60;
    local_d8._8_8_ = pEStack_58;
    pCVar9 = Kernel::Clause::fromArray(&local_70,2,(Inference *)local_d8);
    Shell::TPTPPrinter::toString_abi_cxx11_((string *)local_d8,(TPTPPrinter *)pCVar9,unit_01);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_d8._0_8_,local_d8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._0_8_ != &local_c8) {
      operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._M_allocated_capacity + 1));
    }
  }
  local_d8._0_8_ = &local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d8,*(long *)(Lib::env + 0x6a70),
             *(long *)(Lib::env + 0x6a78) + *(long *)(Lib::env + 0x6a70));
  iVar7 = std::__cxx11::string::compare(local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._0_8_ != &local_c8) {
    operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._M_allocated_capacity + 1));
  }
  if (iVar7 != 0) {
    outputClausesToLaTeX((Problem *)local_a8._8_8_);
  }
  vampireReturnValue = 0;
  if ((UnitList *)local_a8._0_8_ != (UnitList *)0x0) {
    ppLVar1 = (List<Kernel::Unit_*> **)(local_a8._0_8_ + 8);
    *(int *)ppLVar1 = *(int *)ppLVar1 + -1;
    if (*(int *)ppLVar1 == 0) {
      (**(code **)&(*(Unit **)local_a8._0_8_)->_inference)();
    }
  }
  uVar4 = local_a8._8_8_;
  if ((Problem *)local_a8._8_8_ != (Problem *)0x0) {
    Kernel::Problem::~Problem((Problem *)local_a8._8_8_);
    operator_delete((void *)uVar4,0x110);
  }
  Inferences::CompositeISE::~CompositeISE(&local_90);
  return;
}

Assistant:

void clausifyMode(Problem* problem, bool theory)
{
  CompositeISE simplifier;
  simplifier.addFront(new TrivialInequalitiesRemovalISE());
  simplifier.addFront(new TautologyDeletionISE());
  simplifier.addFront(new DuplicateLiteralRemovalISE());

  if (!env.options->strategySamplerFilename().empty()) {
    env.options->sampleStrategy(env.options->strategySamplerFilename());
  }

  ScopedPtr<Problem> prb(preprocessProblem(problem));

  //outputSymbolDeclarations deals with sorts as well for now
  //UIHelper::outputSortDeclarations(std::cout);
  UIHelper::outputSymbolDeclarations(std::cout);

  ClauseIterator cit = prb->clauseIterator();
  bool printed_conjecture = false;
  while (cit.hasNext()) {
    Clause* cl = cit.next();
    cl = simplifier.simplify(cl);
    if (!cl) {
      continue;
    }
    printed_conjecture |= cl->inputType() == UnitInputType::CONJECTURE || cl->inputType() == UnitInputType::NEGATED_CONJECTURE;
    if (theory) {
      Formula* f = Formula::fromClause(cl);

      // CONJECTURE as inputType is evil, as it cannot occur multiple times
      if (cl->inference().inputType() == UnitInputType::CONJECTURE) {
        cl->inference().setInputType(UnitInputType::NEGATED_CONJECTURE);
      }

      FormulaUnit* fu = new FormulaUnit(f,cl->inference()); // we are stealing cl's inference, which is not nice!
      fu->overwriteNumber(cl->number()); // we are also making sure it's number is the same as that of the original (for Kostya from Russia to CASC, with love, and back again)
      std::cout << TPTPPrinter::toString(fu) << "\n";
    } else {
      std::cout << TPTPPrinter::toString(cl) << "\n";
    }
  }
  if(!printed_conjecture && UIHelper::haveConjecture()){
    unsigned p = env.signature->addFreshPredicate(0,"p");
    auto c = Clause::fromLiterals({
        Literal::create(p, /* polarity */ true , {}),
        Literal::create(p, /* polarity */ false, {})
      }, 
      NonspecificInference0(UnitInputType::NEGATED_CONJECTURE,InferenceRule::INPUT));
    std::cout << TPTPPrinter::toString(c) << "\n";
  }

  if (env.options->latexOutput() != "off") { outputClausesToLaTeX(prb.ptr()); }

  //we have successfully output all clauses, so we'll terminate with zero return value
  vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
}